

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

void aom_highbd_hadamard_16x16_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  tran_low_t *ptVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  
  lVar7 = 0;
  uVar5 = 0;
  ptVar6 = coeff;
  do {
    aom_highbd_hadamard_8x8_c
              (src_diff + (ulong)((uint)lVar7 & 8) * src_stride + (ulong)(uVar5 & 8),src_stride,
               ptVar6);
    ptVar6 = ptVar6 + 0x40;
    uVar5 = uVar5 + 8;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = -0x40;
  do {
    piVar1 = coeff + lVar7 + 0x40;
    piVar2 = coeff + lVar7 + 0x80;
    piVar3 = coeff + lVar7 + 0xc0;
    piVar4 = coeff + lVar7 + 0x100;
    iVar20 = *piVar2 + *piVar1 >> 1;
    iVar21 = piVar2[1] + piVar1[1] >> 1;
    iVar22 = piVar2[2] + piVar1[2] >> 1;
    iVar23 = piVar2[3] + piVar1[3] >> 1;
    iVar8 = *piVar1 - *piVar2 >> 1;
    iVar9 = piVar1[1] - piVar2[1] >> 1;
    iVar10 = piVar1[2] - piVar2[2] >> 1;
    iVar11 = piVar1[3] - piVar2[3] >> 1;
    iVar12 = *piVar4 + *piVar3 >> 1;
    iVar13 = piVar4[1] + piVar3[1] >> 1;
    iVar14 = piVar4[2] + piVar3[2] >> 1;
    iVar15 = piVar4[3] + piVar3[3] >> 1;
    iVar16 = *piVar3 - *piVar4 >> 1;
    iVar17 = piVar3[1] - piVar4[1] >> 1;
    iVar18 = piVar3[2] - piVar4[2] >> 1;
    iVar19 = piVar3[3] - piVar4[3] >> 1;
    ptVar6 = coeff + lVar7 + 0x40;
    *ptVar6 = iVar12 + iVar20;
    ptVar6[1] = iVar13 + iVar21;
    ptVar6[2] = iVar14 + iVar22;
    ptVar6[3] = iVar15 + iVar23;
    ptVar6 = coeff + lVar7 + 0x80;
    *ptVar6 = iVar16 + iVar8;
    ptVar6[1] = iVar17 + iVar9;
    ptVar6[2] = iVar18 + iVar10;
    ptVar6[3] = iVar19 + iVar11;
    ptVar6 = coeff + lVar7 + 0xc0;
    *ptVar6 = iVar20 - iVar12;
    ptVar6[1] = iVar21 - iVar13;
    ptVar6[2] = iVar22 - iVar14;
    ptVar6[3] = iVar23 - iVar15;
    ptVar6 = coeff + lVar7 + 0x100;
    *ptVar6 = iVar8 - iVar16;
    ptVar6[1] = iVar9 - iVar17;
    ptVar6[2] = iVar10 - iVar18;
    ptVar6[3] = iVar11 - iVar19;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0);
  return;
}

Assistant:

void aom_highbd_hadamard_16x16_c(const int16_t *src_diff, ptrdiff_t src_stride,
                                 tran_low_t *coeff) {
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 13 bit, dynamic range [-4095, 4095]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_highbd_hadamard_8x8_c(src_ptr, src_stride, coeff + idx * 64);
  }

  // coeff: 19 bit, dynamic range [-262080, 262080]
  for (idx = 0; idx < 64; ++idx) {
    tran_low_t a0 = coeff[0];
    tran_low_t a1 = coeff[64];
    tran_low_t a2 = coeff[128];
    tran_low_t a3 = coeff[192];

    tran_low_t b0 = (a0 + a1) >> 1;
    tran_low_t b1 = (a0 - a1) >> 1;
    tran_low_t b2 = (a2 + a3) >> 1;
    tran_low_t b3 = (a2 - a3) >> 1;

    // new coeff dynamic range: 20 bit
    coeff[0] = b0 + b2;
    coeff[64] = b1 + b3;
    coeff[128] = b0 - b2;
    coeff[192] = b1 - b3;

    ++coeff;
  }
}